

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t ZSTD_compressBlock_fast_extDict_generic
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize,
                 U32 mls)

{
  long *plVar1;
  ulong *iEnd;
  int *piVar2;
  ulong *puVar3;
  undefined8 *puVar4;
  BYTE *pBVar5;
  U32 *pUVar6;
  seqDef *psVar7;
  uint uVar8;
  undefined8 uVar9;
  bool bVar10;
  char cVar11;
  uint uVar12;
  uint uVar13;
  BYTE *pStart;
  ulong *puVar14;
  size_t sVar15;
  ulong *puVar16;
  ulong *puVar17;
  byte bVar18;
  byte bVar19;
  uint uVar20;
  uint uVar21;
  int *piVar22;
  ulong *puVar23;
  ulong *puVar24;
  U32 UVar25;
  BYTE *litEnd;
  ulong uVar26;
  ulong uVar27;
  BYTE *pBVar28;
  BYTE *pBVar29;
  int *piVar30;
  ulong *puVar31;
  uint uVar32;
  long lVar33;
  long lVar34;
  ulong uVar35;
  ulong uVar36;
  ulong uVar37;
  BYTE *pBVar38;
  int iVar39;
  uint uVar40;
  ulong *puVar41;
  uint uVar42;
  ulong uVar43;
  ulong uVar44;
  ulong uVar45;
  int iVar46;
  BYTE *pInLoopLimit;
  BYTE *litLimit_w_1;
  BYTE *litLimit_w;
  uint local_dc;
  
  uVar12 = (ms->cParams).targetLength;
  uVar12 = uVar12 + (uVar12 == 0);
  pBVar5 = (ms->window).base;
  iEnd = (ulong *)((long)src + srcSize);
  uVar13 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
  iVar46 = (int)pBVar5;
  iVar39 = (int)iEnd - iVar46;
  uVar32 = (ms->window).lowLimit;
  uVar8 = uVar32;
  if (uVar13 < iVar39 - uVar32) {
    uVar8 = iVar39 - uVar13;
  }
  pUVar6 = ms->hashTable;
  if (ms->loadedDictEnd != 0) {
    uVar8 = uVar32;
  }
  puVar3 = (ulong *)((long)src + (srcSize - 8));
  uVar32 = (ms->window).dictLimit;
  uVar40 = *rep;
  uVar42 = rep[1];
  cVar11 = (char)(ms->cParams).hashLog;
  puVar41 = (ulong *)src;
  if (uVar8 < uVar32) {
    if (src < puVar3) {
      pBVar38 = (ms->window).dictBase;
      piVar2 = (int *)(pBVar5 + uVar32);
      puVar14 = (ulong *)(pBVar38 + uVar32);
      bVar18 = 0x40 - cVar11;
      bVar19 = 0x20 - cVar11;
      puVar17 = iEnd + -4;
      do {
        uVar44 = (ulong)(mls - 5);
        switch(uVar44) {
        case 0:
          lVar33 = -0x30e4432345000000;
          break;
        case 1:
          lVar33 = -0x30e4432340650000;
          break;
        case 2:
          lVar33 = -0x30e44323405a9d00;
          break;
        case 3:
          uVar43 = *src * -0x30e44323485a9b9d;
          goto LAB_0015251f;
        default:
          uVar43 = (ulong)((uint)((int)*src * -0x61c8864f) >> (bVar19 & 0x1f));
          goto LAB_00152527;
        }
        uVar43 = lVar33 * *src;
LAB_0015251f:
        uVar43 = uVar43 >> (bVar18 & 0x3f);
LAB_00152527:
        uVar13 = pUVar6[uVar43];
        pBVar29 = pBVar5;
        if (uVar13 < uVar32) {
          pBVar29 = pBVar38;
        }
        uVar26 = (long)src - (long)pBVar5;
        UVar25 = (U32)uVar26;
        uVar20 = UVar25 + 1;
        pBVar28 = pBVar5;
        if (uVar20 - uVar40 < uVar32) {
          pBVar28 = pBVar38;
        }
        pUVar6[uVar43] = UVar25;
        uVar21 = uVar20 - uVar40;
        if (uVar20 < uVar40) {
          __assert_fail("offset_1 <= current +1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x3e88,
                        "size_t ZSTD_compressBlock_fast_extDict_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32)"
                       );
        }
        if (((uVar8 < uVar21) && (2 < (uVar32 - 1) - uVar21)) &&
           (*(int *)(pBVar28 + (uVar20 - uVar40)) == *(int *)((long)src + 1))) {
          puVar16 = iEnd;
          if (uVar21 < uVar32) {
            puVar16 = puVar14;
          }
          sVar15 = ZSTD_count_2segments
                             ((BYTE *)((long)src + 5),
                              (BYTE *)((long)(pBVar28 + (uVar20 - uVar40)) + 4),(BYTE *)iEnd,
                              (BYTE *)puVar16,(BYTE *)piVar2);
          if (seqStore->maxNbSeq <=
              (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
          goto LAB_001536f6;
          if (0x20000 < seqStore->maxNbLit) goto LAB_00153753;
          puVar23 = (ulong *)((long)src + 1);
          uVar43 = (long)puVar23 - (long)puVar41;
          puVar16 = (ulong *)seqStore->lit;
          if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar16 + uVar43))
          goto LAB_00153715;
          if (iEnd < puVar23) goto LAB_00153734;
          if (puVar17 < puVar23) {
            ZSTD_safecopyLiterals((BYTE *)puVar16,(BYTE *)puVar41,(BYTE *)puVar23,(BYTE *)puVar17);
          }
          else {
            uVar27 = puVar41[1];
            *puVar16 = *puVar41;
            puVar16[1] = uVar27;
            if (0x10 < uVar43) {
              pBVar29 = seqStore->lit;
              puVar16 = (ulong *)(pBVar29 + 0x10);
              puVar24 = puVar41 + 2;
              if (0xffffffffffffffe8 < (ulong)((long)puVar16 + (-8 - (long)puVar24)))
              goto LAB_0015380d;
              if (0xffffffffffffffe0 < (ulong)((long)puVar16 + (-0x10 - (long)puVar24)))
              goto LAB_0015382c;
              uVar27 = puVar41[3];
              *puVar16 = *puVar24;
              *(ulong *)(pBVar29 + 0x18) = uVar27;
              if (0x20 < (long)uVar43) {
                lVar33 = 0;
                do {
                  puVar4 = (undefined8 *)((long)puVar41 + lVar33 + 0x20);
                  uVar9 = puVar4[1];
                  pBVar28 = pBVar29 + lVar33 + 0x20;
                  *(undefined8 *)pBVar28 = *puVar4;
                  *(undefined8 *)(pBVar28 + 8) = uVar9;
                  puVar4 = (undefined8 *)((long)puVar41 + lVar33 + 0x30);
                  uVar9 = puVar4[1];
                  *(undefined8 *)(pBVar28 + 0x10) = *puVar4;
                  *(undefined8 *)(pBVar28 + 0x18) = uVar9;
                  lVar33 = lVar33 + 0x20;
                } while (pBVar28 + 0x20 < pBVar29 + uVar43);
              }
            }
          }
          seqStore->lit = seqStore->lit + uVar43;
          if (0xffff < uVar43) {
            if (seqStore->longLengthID != 0) goto LAB_001537cf;
            seqStore->longLengthID = 1;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
          }
          psVar7 = seqStore->sequences;
          psVar7->litLength = (U16)uVar43;
          psVar7->offset = 1;
          if (0xffff < sVar15 + 1) {
            if (seqStore->longLengthID != 0) goto LAB_00153772;
            seqStore->longLengthID = 2;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar7 - (long)seqStore->sequencesStart) >> 3);
          }
          psVar7->matchLength = (U16)(sVar15 + 1);
          seqStore->sequences = psVar7 + 1;
          src = (void *)((long)puVar23 + sVar15 + 4);
          uVar13 = uVar40;
LAB_001529ff:
          uVar40 = uVar13;
          puVar41 = (ulong *)src;
          if (puVar3 < src) goto LAB_00152d1f;
          uVar26 = uVar26 & 0xffffffff;
          switch(uVar44) {
          case 0:
            lVar33 = -0x30e4432345000000;
            break;
          case 1:
            lVar33 = -0x30e4432340650000;
            break;
          case 2:
            lVar33 = -0x30e44323405a9d00;
            break;
          case 3:
            uVar43 = *(long *)(pBVar5 + uVar26 + 2) * -0x30e44323485a9b9d;
            goto LAB_00152a85;
          default:
            uVar43 = (ulong)((uint)(*(int *)(pBVar5 + uVar26 + 2) * -0x61c8864f) >> (bVar19 & 0x1f))
            ;
            goto LAB_00152a8d;
          }
          uVar43 = lVar33 * *(long *)(pBVar5 + uVar26 + 2);
LAB_00152a85:
          uVar43 = uVar43 >> (bVar18 & 0x3f);
LAB_00152a8d:
          pUVar6[uVar43] = UVar25 + 2;
          plVar1 = (long *)((long)src + -2);
          switch(uVar44) {
          case 0:
            lVar33 = -0x30e4432345000000;
            break;
          case 1:
            lVar33 = -0x30e4432340650000;
            break;
          case 2:
            lVar33 = -0x30e44323405a9d00;
            break;
          case 3:
            uVar43 = *plVar1 * -0x30e44323485a9b9d;
            goto LAB_00152b08;
          default:
            uVar43 = (ulong)((uint)(*(int *)plVar1 * -0x61c8864f) >> (bVar19 & 0x1f));
            goto LAB_00152b10;
          }
          uVar43 = lVar33 * *plVar1;
LAB_00152b08:
          uVar43 = uVar43 >> (bVar18 & 0x3f);
LAB_00152b10:
          pUVar6[uVar43] = (int)plVar1 - iVar46;
          do {
            if (puVar3 < src) break;
            UVar25 = (int)src - iVar46;
            uVar13 = UVar25 - uVar42;
            pBVar29 = pBVar5;
            if (uVar13 < uVar32) {
              pBVar29 = pBVar38;
            }
            if (((uVar8 < uVar13) && (2 < (uVar32 - 1) - uVar13)) &&
               (*(int *)(pBVar29 + uVar13) == (int)*src)) {
              puVar16 = iEnd;
              if (uVar13 < uVar32) {
                puVar16 = puVar14;
              }
              sVar15 = ZSTD_count_2segments
                                 ((BYTE *)((long)src + 4),(BYTE *)((long)(pBVar29 + uVar13) + 4),
                                  (BYTE *)iEnd,(BYTE *)puVar16,(BYTE *)piVar2);
              if (seqStore->maxNbSeq <=
                  (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
              goto LAB_001536f6;
              if (0x20000 < seqStore->maxNbLit) goto LAB_00153753;
              puVar16 = (ulong *)seqStore->lit;
              if (seqStore->litStart + seqStore->maxNbLit < puVar16) goto LAB_00153715;
              if (iEnd < puVar41) goto LAB_00153734;
              if (puVar17 < puVar41) {
                ZSTD_safecopyLiterals
                          ((BYTE *)puVar16,(BYTE *)puVar41,(BYTE *)puVar41,(BYTE *)puVar17);
              }
              else {
                uVar43 = puVar41[1];
                *puVar16 = *puVar41;
                puVar16[1] = uVar43;
              }
              psVar7 = seqStore->sequences;
              psVar7->litLength = 0;
              psVar7->offset = 1;
              if (0xffff < sVar15 + 1) {
                if (seqStore->longLengthID != 0) goto LAB_00153772;
                seqStore->longLengthID = 2;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar7 - (long)seqStore->sequencesStart) >> 3);
              }
              psVar7->matchLength = (U16)(sVar15 + 1);
              seqStore->sequences = psVar7 + 1;
              if (mls - 5 < 4) {
                sVar15 = (*(code *)(&DAT_0019f1c8 + *(int *)(&DAT_0019f1c8 + uVar44 * 4)))();
                return sVar15;
              }
              pUVar6[(uint)((int)*src * -0x61c8864f) >> (bVar19 & 0x1f)] = UVar25;
              src = (void *)((long)src + sVar15 + 4);
              bVar10 = true;
              puVar41 = (ulong *)src;
              uVar13 = uVar40;
              uVar40 = uVar42;
            }
            else {
              bVar10 = false;
              uVar13 = uVar42;
            }
            uVar42 = uVar13;
          } while (bVar10);
        }
        else {
          if ((uVar8 <= uVar13) && (piVar22 = (int *)(pBVar29 + uVar13), *piVar22 == (int)*src)) {
            piVar30 = piVar2;
            puVar16 = iEnd;
            if (uVar13 < uVar32) {
              piVar30 = (int *)(pBVar38 + uVar8);
              puVar16 = puVar14;
            }
            sVar15 = ZSTD_count_2segments
                               ((BYTE *)((long)src + 4),(BYTE *)(piVar22 + 1),(BYTE *)iEnd,
                                (BYTE *)puVar16,(BYTE *)piVar2);
            lVar33 = sVar15 + 4;
            if ((piVar30 < piVar22) && (puVar41 < src)) {
              piVar22 = (int *)(pBVar29 + uVar13);
              do {
                piVar22 = (int *)((long)piVar22 + -1);
                puVar16 = (ulong *)((long)src + -1);
                if ((*(BYTE *)puVar16 != *(BYTE *)piVar22) ||
                   (lVar33 = lVar33 + 1, src = puVar16, piVar22 <= piVar30)) break;
              } while (puVar41 < puVar16);
            }
            if ((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3) <
                seqStore->maxNbSeq) {
              if (seqStore->maxNbLit < 0x20001) {
                uVar43 = (long)src - (long)puVar41;
                puVar16 = (ulong *)seqStore->lit;
                if ((BYTE *)((long)puVar16 + uVar43) <= seqStore->litStart + seqStore->maxNbLit) {
                  if (iEnd < src) goto LAB_00153734;
                  if (puVar17 < src) {
                    ZSTD_safecopyLiterals
                              ((BYTE *)puVar16,(BYTE *)puVar41,(BYTE *)src,(BYTE *)puVar17);
                  }
                  else {
                    uVar27 = puVar41[1];
                    *puVar16 = *puVar41;
                    puVar16[1] = uVar27;
                    if (0x10 < uVar43) {
                      pBVar29 = seqStore->lit;
                      puVar16 = (ulong *)(pBVar29 + 0x10);
                      puVar23 = puVar41 + 2;
                      if (0xffffffffffffffe8 < (ulong)((long)puVar16 + (-8 - (long)puVar23)))
                      goto LAB_0015380d;
                      if (0xffffffffffffffe0 < (ulong)((long)puVar16 + (-0x10 - (long)puVar23)))
                      goto LAB_0015382c;
                      uVar27 = puVar41[3];
                      *puVar16 = *puVar23;
                      *(ulong *)(pBVar29 + 0x18) = uVar27;
                      if (0x20 < (long)uVar43) {
                        lVar34 = 0;
                        do {
                          puVar4 = (undefined8 *)((long)puVar41 + lVar34 + 0x20);
                          uVar9 = puVar4[1];
                          pBVar28 = pBVar29 + lVar34 + 0x20;
                          *(undefined8 *)pBVar28 = *puVar4;
                          *(undefined8 *)(pBVar28 + 8) = uVar9;
                          puVar4 = (undefined8 *)((long)puVar41 + lVar34 + 0x30);
                          uVar9 = puVar4[1];
                          *(undefined8 *)(pBVar28 + 0x10) = *puVar4;
                          *(undefined8 *)(pBVar28 + 0x18) = uVar9;
                          lVar34 = lVar34 + 0x20;
                        } while (pBVar28 + 0x20 < pBVar29 + uVar43);
                      }
                    }
                  }
                  seqStore->lit = seqStore->lit + uVar43;
                  if (0xffff < uVar43) {
                    if (seqStore->longLengthID != 0) goto LAB_001537cf;
                    seqStore->longLengthID = 1;
                    seqStore->longLengthPos =
                         (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart)
                              >> 3);
                  }
                  psVar7 = seqStore->sequences;
                  psVar7->litLength = (U16)uVar43;
                  psVar7->offset = (UVar25 - uVar13) + 3;
                  if (0xffff < lVar33 - 3U) {
                    if (seqStore->longLengthID != 0) goto LAB_00153772;
                    seqStore->longLengthID = 2;
                    seqStore->longLengthPos =
                         (U32)((ulong)((long)psVar7 - (long)seqStore->sequencesStart) >> 3);
                  }
                  psVar7->matchLength = (U16)(lVar33 - 3U);
                  seqStore->sequences = psVar7 + 1;
                  src = (void *)((long)src + lVar33);
                  uVar13 = UVar25 - uVar13;
                  uVar42 = uVar40;
                  goto LAB_001529ff;
                }
                goto LAB_00153715;
              }
              goto LAB_00153753;
            }
            goto LAB_001536f6;
          }
          src = (void *)((long)src + ((long)src - (long)puVar41 >> 8) + (ulong)uVar12);
        }
LAB_00152d1f:
      } while (src < puVar3);
    }
    *rep = uVar40;
  }
  else {
    uVar8 = iVar39 - uVar13;
    if (iVar39 - uVar32 <= uVar13) {
      uVar8 = uVar32;
    }
    piVar2 = (int *)(pBVar5 + uVar8);
    puVar14 = (ulong *)((long)src + (ulong)(piVar2 == (int *)src));
    uVar13 = (int)puVar14 - (int)piVar2;
    uVar32 = 0;
    if (uVar13 < uVar42) {
      uVar32 = uVar42;
    }
    puVar17 = (ulong *)((long)src + (ulong)(piVar2 == (int *)src) + 1);
    if (uVar13 < uVar42) {
      uVar42 = 0;
    }
    uVar44 = (ulong)uVar42;
    uVar20 = uVar40;
    if (uVar13 < uVar40) {
      uVar20 = 0;
      uVar32 = uVar40;
    }
    uVar43 = (ulong)uVar20;
    if (puVar17 < puVar3) {
      bVar18 = 0x20 - cVar11;
      puVar16 = (ulong *)((long)iEnd - 7);
      puVar23 = iEnd + -4;
      do {
        uVar13 = mls - 5;
        uVar26 = (ulong)uVar13;
        switch(uVar26) {
        case 0:
          lVar33 = -0x30e4432345000000;
          break;
        case 1:
          lVar33 = -0x30e4432340650000;
          break;
        case 2:
          lVar33 = -0x30e44323405a9d00;
          break;
        case 3:
          uVar27 = *puVar14 * -0x30e44323485a9b9d;
          goto LAB_00152e83;
        default:
          uVar27 = (ulong)((uint)((int)*puVar14 * -0x61c8864f) >> (bVar18 & 0x1f));
          goto LAB_00152e8a;
        }
        uVar27 = lVar33 * *puVar14;
LAB_00152e83:
        uVar27 = uVar27 >> (0x40U - cVar11 & 0x3f);
LAB_00152e8a:
        local_dc = (uint)uVar44;
        switch(uVar26) {
        case 0:
          lVar33 = -0x30e4432345000000;
          break;
        case 1:
          lVar33 = -0x30e4432340650000;
          break;
        case 2:
          lVar33 = -0x30e44323405a9d00;
          break;
        case 3:
          uVar44 = *puVar17 * -0x30e44323485a9b9d;
          goto LAB_00152efe;
        default:
          uVar44 = (ulong)((uint)((int)*puVar17 * -0x61c8864f) >> (bVar18 & 0x1f));
          goto LAB_00152f05;
        }
        uVar44 = lVar33 * *puVar17;
LAB_00152efe:
        uVar44 = uVar44 >> (0x40U - cVar11 & 0x3f);
LAB_00152f05:
        uVar35 = *puVar14;
        uVar37 = *puVar17;
        uVar45 = (long)puVar14 - (long)pBVar5;
        uVar40 = pUVar6[uVar27];
        uVar42 = pUVar6[uVar44];
        UVar25 = (U32)uVar45;
        pUVar6[uVar27] = UVar25;
        pUVar6[uVar44] = (int)puVar17 - iVar46;
        if ((ulong *)((long)puVar14 + 1) != puVar17) {
          __assert_fail("ip0 + 1 == ip1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x3d56,
                        "size_t ZSTD_compressBlock_fast_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32)"
                       );
        }
        uVar20 = (uint)uVar43;
        if (uVar20 == 0) {
LAB_00152f80:
          if (((uVar8 < uVar40) &&
              (piVar30 = (int *)(pBVar5 + uVar40), puVar24 = puVar14, *piVar30 == (int)uVar35)) ||
             ((uVar8 < uVar42 &&
              (piVar30 = (int *)(pBVar5 + uVar42), puVar24 = puVar17, *piVar30 == (int)uVar37)))) {
            uVar40 = (int)puVar24 - (int)piVar30;
            uVar43 = (ulong)uVar40;
            iVar39 = uVar40 + 2;
            local_dc = uVar20;
            if ((piVar2 < piVar30) && (puVar41 < puVar24)) {
              uVar44 = 0;
              do {
                piVar22 = (int *)((long)piVar30 + -1);
                puVar14 = (ulong *)((long)puVar24 + -1);
                if ((*(BYTE *)puVar14 != *(BYTE *)piVar22) ||
                   (uVar44 = uVar44 + 1, piVar30 = piVar22, puVar24 = puVar14, piVar22 <= piVar2))
                break;
              } while (puVar41 < puVar14);
            }
            else {
              uVar44 = 0;
            }
            goto LAB_0015306c;
          }
          uVar44 = ((ulong)((long)puVar14 - (long)puVar41) >> 7) + (ulong)(uVar12 + 1);
          if (uVar44 < 2) {
            __assert_fail("step >= 2",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x3d6a,
                          "size_t ZSTD_compressBlock_fast_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32)"
                         );
          }
          puVar14 = (ulong *)((long)puVar14 + uVar44);
          puVar17 = (ulong *)((long)puVar17 + uVar44);
LAB_001532d3:
          uVar44 = (ulong)local_dc;
        }
        else {
          piVar22 = (int *)((long)puVar14 + 2);
          piVar30 = (int *)((long)piVar22 - uVar43);
          if (*piVar30 != *piVar22) goto LAB_00152f80;
          uVar44 = (ulong)(*(BYTE *)((long)puVar14 + 1) == *(BYTE *)((long)piVar30 + -1));
          iVar39 = 0;
          piVar30 = (int *)((long)piVar30 - uVar44);
          puVar24 = (ulong *)((long)piVar22 - uVar44);
LAB_0015306c:
          puVar17 = (ulong *)((long)puVar24 + uVar44 + 4);
          puVar31 = (ulong *)((long)piVar30 + uVar44 + 4);
          puVar14 = puVar17;
          if (puVar17 < puVar16) {
            uVar35 = *puVar17 ^ *puVar31;
            uVar27 = 0;
            if (uVar35 != 0) {
              for (; (uVar35 >> uVar27 & 1) == 0; uVar27 = uVar27 + 1) {
              }
            }
            pBVar38 = (BYTE *)(uVar27 >> 3 & 0x1fffffff);
            if (*puVar31 == *puVar17) {
              puVar14 = (ulong *)((long)puVar24 + uVar44 + 0xc);
              puVar31 = (ulong *)((long)piVar30 + uVar44 + 0xc);
              do {
                if (puVar16 <= puVar14) goto LAB_001530f0;
                uVar27 = *puVar31;
                uVar35 = *puVar14;
                uVar36 = uVar35 ^ uVar27;
                uVar37 = 0;
                if (uVar36 != 0) {
                  for (; (uVar36 >> uVar37 & 1) == 0; uVar37 = uVar37 + 1) {
                  }
                }
                pBVar38 = (BYTE *)((long)puVar14 + ((uVar37 >> 3 & 0x1fffffff) - (long)puVar17));
                puVar14 = puVar14 + 1;
                puVar31 = puVar31 + 1;
              } while (uVar27 == uVar35);
            }
          }
          else {
LAB_001530f0:
            if ((puVar14 < (ulong *)((long)iEnd - 3U)) && ((int)*puVar31 == (int)*puVar14)) {
              puVar14 = (ulong *)((long)puVar14 + 4);
              puVar31 = (ulong *)((long)puVar31 + 4);
            }
            if ((puVar14 < (ulong *)((long)iEnd - 1U)) && ((short)*puVar31 == (short)*puVar14)) {
              puVar14 = (ulong *)((long)puVar14 + 2);
              puVar31 = (ulong *)((long)puVar31 + 2);
            }
            if (puVar14 < iEnd) {
              puVar14 = (ulong *)((long)puVar14 + (ulong)((BYTE)*puVar31 == (BYTE)*puVar14));
            }
            pBVar38 = (BYTE *)((long)puVar14 - (long)puVar17);
          }
          if (seqStore->maxNbSeq <=
              (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
LAB_001536f6:
            __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x2038,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          if (0x20000 < seqStore->maxNbLit) {
LAB_00153753:
            __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x203a,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          uVar27 = (long)puVar24 - (long)puVar41;
          puVar14 = (ulong *)seqStore->lit;
          if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar14 + uVar27)) {
LAB_00153715:
            __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x203b,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          if (iEnd < puVar24) {
LAB_00153734:
            __assert_fail("literals + litLength <= litLimit",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x203c,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          if (puVar23 < puVar24) {
            ZSTD_safecopyLiterals((BYTE *)puVar14,(BYTE *)puVar41,(BYTE *)puVar24,(BYTE *)puVar23);
          }
          else {
            uVar35 = puVar41[1];
            *puVar14 = *puVar41;
            puVar14[1] = uVar35;
            if (0x10 < uVar27) {
              pBVar29 = seqStore->lit;
              puVar14 = (ulong *)(pBVar29 + 0x10);
              puVar17 = puVar41 + 2;
              if (0xffffffffffffffe8 < (ulong)((long)puVar14 + (-8 - (long)puVar17))) {
LAB_0015380d:
                __assert_fail("diff >= 8 || (ovtype == ZSTD_no_overlap && diff <= -WILDCOPY_VECLEN)"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x1268,
                              "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                             );
              }
              if (0xffffffffffffffe0 < (ulong)((long)puVar14 + (-0x10 - (long)puVar17))) {
LAB_0015382c:
                __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x1270,
                              "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                             );
              }
              uVar35 = puVar41[3];
              *puVar14 = *puVar17;
              *(ulong *)(pBVar29 + 0x18) = uVar35;
              if (0x20 < (long)uVar27) {
                lVar33 = 0;
                do {
                  puVar4 = (undefined8 *)((long)puVar41 + lVar33 + 0x20);
                  uVar9 = puVar4[1];
                  pBVar28 = pBVar29 + lVar33 + 0x20;
                  *(undefined8 *)pBVar28 = *puVar4;
                  *(undefined8 *)(pBVar28 + 8) = uVar9;
                  puVar4 = (undefined8 *)((long)puVar41 + lVar33 + 0x30);
                  uVar9 = puVar4[1];
                  *(undefined8 *)(pBVar28 + 0x10) = *puVar4;
                  *(undefined8 *)(pBVar28 + 0x18) = uVar9;
                  lVar33 = lVar33 + 0x20;
                } while (pBVar28 + 0x20 < pBVar29 + uVar27);
              }
            }
          }
          seqStore->lit = seqStore->lit + uVar27;
          if (0xffff < uVar27) {
            if (seqStore->longLengthID != 0) {
LAB_001537cf:
              __assert_fail("seqStorePtr->longLengthID == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x204d,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            seqStore->longLengthID = 1;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
          }
          psVar7 = seqStore->sequences;
          psVar7->litLength = (U16)uVar27;
          psVar7->offset = iVar39 + 1;
          if ((BYTE *)0xffff < pBVar38 + uVar44 + 1) {
            if (seqStore->longLengthID != 0) {
LAB_00153772:
              __assert_fail("seqStorePtr->longLengthID == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x2058,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            seqStore->longLengthID = 2;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar7 - (long)seqStore->sequencesStart) >> 3);
          }
          psVar7->matchLength = (U16)(pBVar38 + uVar44 + 1);
          seqStore->sequences = psVar7 + 1;
          puVar14 = (ulong *)((long)puVar24 + (long)(pBVar38 + uVar44 + 4));
          puVar17 = (ulong *)((long)puVar24 + (long)(pBVar38 + uVar44 + 5));
          puVar41 = puVar14;
          if (puVar3 < puVar14) goto LAB_001532d3;
          if (pBVar5 + (uVar45 & 0xffffffff) + 2 <= src) {
            __assert_fail("base+current0+2 > istart",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x3d84,
                          "size_t ZSTD_compressBlock_fast_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32)"
                         );
          }
          if (uVar13 < 4) {
            sVar15 = (*(code *)(&DAT_0019f168 + *(int *)(&DAT_0019f168 + uVar26 * 4)))
                               (uVar26,&DAT_0019f168,
                                &DAT_0019f168 + *(int *)(&DAT_0019f168 + uVar26 * 4));
            return sVar15;
          }
          pUVar6[(uint)(*(int *)(pBVar5 + (uVar45 & 0xffffffff) + 2) * -0x61c8864f) >>
                 (bVar18 & 0x1f)] = UVar25 + 2;
          if (uVar13 < 4) {
            sVar15 = (*(code *)(&DAT_0019f178 + *(int *)(&DAT_0019f178 + uVar26 * 4)))();
            return sVar15;
          }
          uVar44 = (ulong)local_dc;
          pUVar6[(uint)(*(int *)((long)puVar14 + -2) * -0x61c8864f) >> (bVar18 & 0x1f)] =
               (int)(int *)((long)puVar14 + -2) - iVar46;
          if (((local_dc != 0) && (puVar14 <= puVar3)) &&
             (iVar39 = (int)*puVar14, uVar27 = uVar44, iVar39 == *(int *)((long)puVar14 - uVar44)))
          {
            do {
              uVar44 = uVar43;
              uVar43 = (ulong)local_dc;
              puVar41 = (ulong *)((long)puVar14 + 4);
              puVar24 = (ulong *)((long)puVar14 + (4 - uVar27));
              puVar17 = puVar41;
              if (puVar41 < puVar16) {
                uVar37 = *puVar41 ^ *puVar24;
                uVar35 = 0;
                if (uVar37 != 0) {
                  for (; (uVar37 >> uVar35 & 1) == 0; uVar35 = uVar35 + 1) {
                  }
                }
                pBVar38 = (BYTE *)(uVar35 >> 3 & 0x1fffffff);
                if (*puVar24 == *puVar41) {
                  puVar17 = (ulong *)((long)puVar14 + 0xc);
                  puVar24 = (ulong *)((long)puVar14 + (0xc - uVar27));
                  do {
                    if (puVar16 <= puVar17) goto LAB_001534ab;
                    uVar27 = *puVar24;
                    uVar35 = *puVar17;
                    uVar45 = uVar35 ^ uVar27;
                    uVar37 = 0;
                    if (uVar45 != 0) {
                      for (; (uVar45 >> uVar37 & 1) == 0; uVar37 = uVar37 + 1) {
                      }
                    }
                    pBVar38 = (BYTE *)((long)puVar17 + ((uVar37 >> 3 & 0x1fffffff) - (long)puVar41))
                    ;
                    puVar17 = puVar17 + 1;
                    puVar24 = puVar24 + 1;
                  } while (uVar27 == uVar35);
                }
              }
              else {
LAB_001534ab:
                if ((puVar17 < (ulong *)((long)iEnd - 3U)) && ((int)*puVar24 == (int)*puVar17)) {
                  puVar17 = (ulong *)((long)puVar17 + 4);
                  puVar24 = (ulong *)((long)puVar24 + 4);
                }
                if ((puVar17 < (ulong *)((long)iEnd - 1U)) && ((short)*puVar24 == (short)*puVar17))
                {
                  puVar17 = (ulong *)((long)puVar17 + 2);
                  puVar24 = (ulong *)((long)puVar24 + 2);
                }
                if (puVar17 < iEnd) {
                  puVar17 = (ulong *)((long)puVar17 + (ulong)((BYTE)*puVar24 == (BYTE)*puVar17));
                }
                pBVar38 = (BYTE *)((long)puVar17 - (long)puVar41);
              }
              if (uVar13 < 4) {
                sVar15 = (*(code *)(&DAT_0019f188 + *(int *)(&DAT_0019f188 + uVar26 * 4)))();
                return sVar15;
              }
              pUVar6[(uint)(iVar39 * -0x61c8864f) >> (bVar18 & 0x1f)] = (int)puVar14 - iVar46;
              if (seqStore->maxNbSeq <=
                  (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
              goto LAB_001536f6;
              if (0x20000 < seqStore->maxNbLit) goto LAB_00153753;
              puVar41 = (ulong *)seqStore->lit;
              if (seqStore->litStart + seqStore->maxNbLit < puVar41) goto LAB_00153715;
              if (iEnd < puVar14) goto LAB_00153734;
              if (puVar23 < puVar14) {
                ZSTD_safecopyLiterals
                          ((BYTE *)puVar41,(BYTE *)puVar14,(BYTE *)puVar14,(BYTE *)puVar23);
              }
              else {
                uVar27 = puVar14[1];
                *puVar41 = *puVar14;
                puVar41[1] = uVar27;
              }
              psVar7 = seqStore->sequences;
              psVar7->litLength = 0;
              psVar7->offset = 1;
              if ((BYTE *)0xffff < pBVar38 + 1) {
                if (seqStore->longLengthID != 0) goto LAB_00153772;
                seqStore->longLengthID = 2;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar7 - (long)seqStore->sequencesStart) >> 3);
              }
              puVar14 = (ulong *)((long)puVar14 + (long)(pBVar38 + 4));
              psVar7->matchLength = (U16)(pBVar38 + 1);
              seqStore->sequences = psVar7 + 1;
              local_dc = (uint)uVar44;
            } while (((local_dc != 0) && (puVar14 <= puVar3)) &&
                    (iVar39 = (int)*puVar14, uVar27 = uVar44,
                    iVar39 == *(int *)((long)puVar14 - uVar44)));
            puVar17 = (ulong *)((long)puVar14 + 1);
            puVar41 = puVar14;
          }
        }
        uVar42 = (uint)uVar44;
        uVar20 = (uint)uVar43;
      } while (puVar17 < puVar3);
    }
    if (uVar20 == 0) {
      uVar20 = uVar32;
    }
    *rep = uVar20;
    if (uVar42 == 0) {
      uVar42 = uVar32;
    }
  }
  rep[1] = uVar42;
  return (long)iEnd - (long)puVar41;
}

Assistant:

static size_t ZSTD_compressBlock_fast_extDict_generic(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize, U32 const mls)
{
    const ZSTD_compressionParameters* const cParams = &ms->cParams;
    U32* const hashTable = ms->hashTable;
    U32 const hlog = cParams->hashLog;
    /* support stepSize of 0 */
    U32 const stepSize = cParams->targetLength + !(cParams->targetLength);
    const BYTE* const base = ms->window.base;
    const BYTE* const dictBase = ms->window.dictBase;
    const BYTE* const istart = (const BYTE*)src;
    const BYTE* ip = istart;
    const BYTE* anchor = istart;
    const U32   endIndex = (U32)((size_t)(istart - base) + srcSize);
    const U32   lowLimit = ZSTD_getLowestMatchIndex(ms, endIndex, cParams->windowLog);
    const U32   dictStartIndex = lowLimit;
    const BYTE* const dictStart = dictBase + dictStartIndex;
    const U32   dictLimit = ms->window.dictLimit;
    const U32   prefixStartIndex = dictLimit < lowLimit ? lowLimit : dictLimit;
    const BYTE* const prefixStart = base + prefixStartIndex;
    const BYTE* const dictEnd = dictBase + prefixStartIndex;
    const BYTE* const iend = istart + srcSize;
    const BYTE* const ilimit = iend - 8;
    U32 offset_1=rep[0], offset_2=rep[1];

    DEBUGLOG(5, "ZSTD_compressBlock_fast_extDict_generic");

    /* switch to "regular" variant if extDict is invalidated due to maxDistance */
    if (prefixStartIndex == dictStartIndex)
        return ZSTD_compressBlock_fast_generic(ms, seqStore, rep, src, srcSize, mls);

    /* Search Loop */
    while (ip < ilimit) {  /* < instead of <=, because (ip+1) */
        const size_t h = ZSTD_hashPtr(ip, hlog, mls);
        const U32    matchIndex = hashTable[h];
        const BYTE* const matchBase = matchIndex < prefixStartIndex ? dictBase : base;
        const BYTE*  match = matchBase + matchIndex;
        const U32    current = (U32)(ip-base);
        const U32    repIndex = current + 1 - offset_1;
        const BYTE* const repBase = repIndex < prefixStartIndex ? dictBase : base;
        const BYTE* const repMatch = repBase + repIndex;
        hashTable[h] = current;   /* update hash table */
        assert(offset_1 <= current +1);   /* check repIndex */

        if ( (((U32)((prefixStartIndex-1) - repIndex) >= 3) /* intentional underflow */ & (repIndex > dictStartIndex))
           && (MEM_read32(repMatch) == MEM_read32(ip+1)) ) {
            const BYTE* const repMatchEnd = repIndex < prefixStartIndex ? dictEnd : iend;
            size_t const rLength = ZSTD_count_2segments(ip+1 +4, repMatch +4, iend, repMatchEnd, prefixStart) + 4;
            ip++;
            ZSTD_storeSeq(seqStore, (size_t)(ip-anchor), anchor, iend, 0, rLength-MINMATCH);
            ip += rLength;
            anchor = ip;
        } else {
            if ( (matchIndex < dictStartIndex) ||
                 (MEM_read32(match) != MEM_read32(ip)) ) {
                assert(stepSize >= 1);
                ip += ((ip-anchor) >> kSearchStrength) + stepSize;
                continue;
            }
            {   const BYTE* const matchEnd = matchIndex < prefixStartIndex ? dictEnd : iend;
                const BYTE* const lowMatchPtr = matchIndex < prefixStartIndex ? dictStart : prefixStart;
                U32 const offset = current - matchIndex;
                size_t mLength = ZSTD_count_2segments(ip+4, match+4, iend, matchEnd, prefixStart) + 4;
                while (((ip>anchor) & (match>lowMatchPtr)) && (ip[-1] == match[-1])) { ip--; match--; mLength++; }   /* catch up */
                offset_2 = offset_1; offset_1 = offset;  /* update offset history */
                ZSTD_storeSeq(seqStore, (size_t)(ip-anchor), anchor, iend, offset + ZSTD_REP_MOVE, mLength-MINMATCH);
                ip += mLength;
                anchor = ip;
        }   }

        if (ip <= ilimit) {
            /* Fill Table */
            hashTable[ZSTD_hashPtr(base+current+2, hlog, mls)] = current+2;
            hashTable[ZSTD_hashPtr(ip-2, hlog, mls)] = (U32)(ip-2-base);
            /* check immediate repcode */
            while (ip <= ilimit) {
                U32 const current2 = (U32)(ip-base);
                U32 const repIndex2 = current2 - offset_2;
                const BYTE* const repMatch2 = repIndex2 < prefixStartIndex ? dictBase + repIndex2 : base + repIndex2;
                if ( (((U32)((prefixStartIndex-1) - repIndex2) >= 3) & (repIndex2 > dictStartIndex))  /* intentional overflow */
                   && (MEM_read32(repMatch2) == MEM_read32(ip)) ) {
                    const BYTE* const repEnd2 = repIndex2 < prefixStartIndex ? dictEnd : iend;
                    size_t const repLength2 = ZSTD_count_2segments(ip+4, repMatch2+4, iend, repEnd2, prefixStart) + 4;
                    { U32 const tmpOffset = offset_2; offset_2 = offset_1; offset_1 = tmpOffset; }  /* swap offset_2 <=> offset_1 */
                    ZSTD_storeSeq(seqStore, 0 /*litlen*/, anchor, iend, 0 /*offcode*/, repLength2-MINMATCH);
                    hashTable[ZSTD_hashPtr(ip, hlog, mls)] = current2;
                    ip += repLength2;
                    anchor = ip;
                    continue;
                }
                break;
    }   }   }

    /* save reps for next block */
    rep[0] = offset_1;
    rep[1] = offset_2;

    /* Return the last literals size */
    return (size_t)(iend - anchor);
}